

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void gatom_clipfloat(t_gatom *x,t_atom *ap,t_float f)

{
  float fVar1;
  float fVar2;
  
  fVar1 = x->a_draghi;
  fVar2 = x->a_draglo;
  if ((((fVar2 != 0.0) || (NAN(fVar2))) || (fVar1 != 0.0)) || (NAN(fVar1))) {
    if (fVar2 <= f) {
      fVar2 = f;
    }
    f = fVar2;
    if (fVar1 < fVar2) {
      f = fVar1;
    }
  }
  (ap->a_w).w_float = f;
  gatom_senditup(x);
  gatom_bang(x);
  return;
}

Assistant:

static void gatom_clipfloat(t_gatom *x, t_atom *ap, t_float f)
{
    if (x->a_draglo != 0 || x->a_draghi != 0)
    {
        if (f < x->a_draglo)
            f = x->a_draglo;
        if (f > x->a_draghi)
            f = x->a_draghi;
    }
    ap->a_w.w_float = f;
    gatom_senditup(x);
    gatom_bang(x);
}